

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

Address * __thiscall
cfd::core::Extkey::GetPubkeyAddress
          (Address *__return_storage_ptr__,Extkey *this,AddressType address_type,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters,NetType net_type)

{
  bool bVar1;
  undefined8 uVar2;
  reference object;
  Address *pAVar3;
  CfdError error_code;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff84;
  allocator local_69;
  string local_68 [32];
  undefined1 local_48 [8];
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> addresses;
  NetType net_type_local;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *network_parameters_local;
  AddressType address_type_local;
  Extkey *this_local;
  
  pAVar3 = __return_storage_ptr__;
  addresses.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = net_type;
  GetPubkeyAddressesInternal
            ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)local_48,this,
             address_type,network_parameters,net_type);
  bVar1 = ::std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::empty
                    ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)local_48);
  if (!bVar1) {
    object = ::std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::operator[]
                       ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)local_48,
                        0);
    core::Address::Address(__return_storage_ptr__,object);
    ::std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector
              ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
               __return_storage_ptr__);
    return pAVar3;
  }
  uVar4 = CONCAT13(1,(int3)in_stack_ffffffffffffff80);
  uVar2 = __cxa_allocate_exception(0x30);
  error_code = (CfdError)((ulong)pAVar3 >> 0x20);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_68,"address list is empty.",&local_69);
  CfdException::CfdException
            ((CfdException *)CONCAT44(in_stack_ffffffffffffff84,uVar4),error_code,
             (string *)__return_storage_ptr__);
  __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Address Extkey::GetPubkeyAddress(
    AddressType address_type,
    const std::vector<AddressFormatData>* network_parameters,
    NetType net_type) {
  auto addresses = GetPubkeyAddressesInternal(
      *this, address_type, network_parameters, net_type);
  if (addresses.empty()) {
    throw CfdException(CfdError::kCfdInternalError, "address list is empty.");
  }
  return addresses[0];
}